

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line.cpp
# Opt level: O3

void line_x_validate(Am_Web_Events *events)

{
  bool bVar1;
  Am_Slot_Key AVar2;
  int value;
  int value_00;
  int iVar3;
  int iVar4;
  int iVar5;
  Am_Value *pAVar6;
  char *pcVar7;
  ostream *poVar8;
  Am_Object self;
  Am_Style ls;
  Am_Slot slot;
  int wh_adjustment;
  int rb_adjustment;
  int lt_adjustment;
  Am_Object AStack_68;
  uint local_5c;
  Am_Object local_58;
  int local_50;
  uint local_4c;
  Am_Slot local_48;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  
  Am_Web_Events::Start(events);
  local_48 = Am_Web_Events::Get(events);
  Am_Slot::Get_Owner((Am_Slot *)&local_58);
  Am_Object::Am_Object(&AStack_68,&local_58);
  Am_Object::~Am_Object(&local_58);
  pAVar6 = Am_Object::Get(&AStack_68,0x8b,0);
  value = Am_Value::operator_cast_to_int(pAVar6);
  pAVar6 = Am_Object::Get(&AStack_68,0x8d,0);
  value_00 = Am_Value::operator_cast_to_int(pAVar6);
  pAVar6 = Am_Object::Get(&AStack_68,100,0);
  iVar3 = Am_Value::operator_cast_to_int(pAVar6);
  pAVar6 = Am_Object::Get(&AStack_68,0x66,0);
  iVar4 = Am_Value::operator_cast_to_int(pAVar6);
  pAVar6 = Am_Object::Get(&AStack_68,0x6b,0);
  Am_Style::Am_Style((Am_Style *)&local_58,pAVar6);
  get_thickness_adjustments((Am_Style *)&local_58,&local_34,&local_38,&local_3c);
  local_50 = local_38;
  local_40 = local_3c;
  local_4c = 0;
  local_5c = 0;
  do {
    bVar1 = Am_Web_Events::Last(events);
    if (bVar1) {
      if ((local_5c & 1) != 0) {
        Am_Object::Set(&AStack_68,0x8b,value,0);
        Am_Object::Set(&AStack_68,0x8d,value_00,0);
      }
      if ((local_4c & 1) != 0) {
        Am_Object::Set(&AStack_68,100,iVar3,0);
        Am_Object::Set(&AStack_68,0x66,iVar4,0);
      }
      Am_Style::~Am_Style((Am_Style *)&local_58);
      Am_Object::~Am_Object(&AStack_68);
      return;
    }
    local_48 = Am_Web_Events::Get(events);
    AVar2 = Am_Slot::Get_Key(&local_48);
    if (AVar2 < 0x6b) {
      if ((AVar2 != 100) && (AVar2 != 0x66)) {
LAB_001e528b:
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"** Amulet_Error: ",0x11);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"** Bug: unexpected slot in line_x_validate: ",0x2c);
        AVar2 = Am_Slot::Get_Key(&local_48);
        pcVar7 = Am_Get_Slot_Name(AVar2);
        poVar8 = std::operator<<((ostream *)&std::cerr,pcVar7);
        std::endl<char,std::char_traits<char>>(poVar8);
        Am_Error();
      }
      if (value < value_00) {
        value = iVar3 + local_34;
        value_00 = (iVar4 + iVar3) - local_50;
      }
      else {
        value = (iVar4 + iVar3) - local_50;
        value_00 = iVar3 + local_34;
      }
      local_5c = (uint)CONCAT71((uint7)(byte)(AVar2 >> 8),1);
    }
    else if (AVar2 != 0x6b) {
      if ((AVar2 != 0x8b) && (AVar2 != 0x8d)) goto LAB_001e528b;
      iVar5 = value - value_00;
      iVar3 = value_00;
      if (value < value_00) {
        iVar3 = value;
      }
      iVar3 = iVar3 - local_34;
      iVar4 = iVar5;
      if (iVar5 < 0) {
        iVar4 = -iVar5;
      }
      iVar4 = iVar4 + local_40;
      local_4c = (uint)CONCAT71((uint7)(uint3)((uint)-iVar5 >> 8),1);
    }
    Am_Web_Events::Next(events);
  } while( true );
}

Assistant:

void
line_x_validate(Am_Web_Events &events)
{
  bool x1x2_changed = false;
  bool leftwidth_changed = false;

  events.Start();
  Am_Slot slot = events.Get();
  Am_Object self = slot.Get_Owner();
  int x1 = self.Get(Am_X1);
  int x2 = self.Get(Am_X2);
  int left = self.Get(Am_LEFT);
  int width = self.Get(Am_WIDTH);
  Am_Style ls = self.Get(Am_LINE_STYLE);
  int lt_adjustment, rb_adjustment, wh_adjustment;
  get_thickness_adjustments(ls, lt_adjustment, rb_adjustment, wh_adjustment);
  while (!events.Last()) {
    slot = events.Get();
    //std::cout << "__Line_x_Web " << self << " slot " << slot.Get_Key ()
    //  << " l,w,x1,x2 " << left << " " << width << " " << x1 << " " << x2
    //	 <<std::endl <<std::flush;
    switch (slot.Get_Key()) {
    case Am_X1:
    case Am_X2:
      left = imin(x1, x2) - lt_adjustment;
      width = iabs(x2 - x1) + wh_adjustment;
      leftwidth_changed = true;
      //std::cout << "__  left " << left << " width " << width <<std::endl <<std::flush;
      break;
    case Am_LEFT:
    case Am_WIDTH:
      if (x1 < x2) {
        x1 = left + lt_adjustment;
        x2 = left + width - rb_adjustment;
      } else {
        x1 = left + width - rb_adjustment;
        x2 = left + lt_adjustment;
      }
      x1x2_changed = true;
      //std::cout << "__  x1 " << x1 << " x2 " << x2 <<std::endl <<std::flush;
      break;
    case Am_LINE_STYLE:
      break;
    default:
      Am_ERROR("** Bug: unexpected slot in line_x_validate: "
               << Am_Get_Slot_Name(slot.Get_Key()));
    }
    events.Next();
  }

  if (x1x2_changed) {
    self.Set(Am_X1, x1);
    self.Set(Am_X2, x2);
  }

  if (leftwidth_changed) {
    self.Set(Am_LEFT, left);
    self.Set(Am_WIDTH, width);
  }
}